

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int SDL_PollEvent(SDL12_Event *event12)

{
  EventQueueType *pEVar1;
  int iVar2;
  
  if (EventQueueMutex == (SDL_mutex *)0x0) {
    iVar2 = 0;
  }
  else {
    (*SDL20_LockMutex)(EventQueueMutex);
    SDL_PumpEvents();
    if (EventQueueHead == (EventQueueType *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
      if (event12 != (SDL12_Event *)0x0) {
        (*SDL20_memcpy)(event12,&EventQueueHead->event12,0x18);
        pEVar1 = EventQueueHead->next;
        EventQueueHead->next = EventQueueAvailable;
        EventQueueAvailable = EventQueueHead;
        EventQueueHead = pEVar1;
        if (pEVar1 == (EventQueueType *)0x0) {
          EventQueueTail = (EventQueueType *)0x0;
        }
      }
    }
    (*SDL20_UnlockMutex)(EventQueueMutex);
  }
  return iVar2;
}

Assistant:

SDLCALL
SDL_PollEvent(SDL12_Event *event12)
{
    int retval;

    if (!EventQueueMutex) {
        return 0;
    }

    SDL20_LockMutex(EventQueueMutex);
    retval = SDL_PollEvent_locked(event12);
    SDL20_UnlockMutex(EventQueueMutex);

    return retval;
}